

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
boost::any::any<std::__cxx11::string&>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          type *param_3,type *param_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  undefined8 *in_RDI;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  
  value_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x28)
  ;
  holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::holder
            (in_stack_ffffffffffffffd0,value_00);
  *in_RDI = value_00;
  return;
}

Assistant:

any(ValueType&& value
            , typename boost::disable_if<boost::is_same<any&, ValueType> >::type* = 0 // disable if value has type `any&`
            , typename boost::disable_if<boost::is_const<ValueType> >::type* = 0) // disable if value has type `const ValueType&&`
          : content(new holder< typename decay<ValueType>::type >(static_cast<ValueType&&>(value)))
        {
        }